

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void reindexTable(Parse *pParse,Table *pTab,char *zColl)

{
  byte bVar1;
  Index *pIndex;
  Schema *pSVar2;
  Schema **ppSVar3;
  int iDb;
  ulong uVar4;
  long lVar5;
  
  if (pTab->eTabType != '\x01') {
    for (pIndex = pTab->pIndex; pIndex != (Index *)0x0; pIndex = pIndex->pNext) {
      if (zColl == (char *)0x0) {
LAB_001b5149:
        if (pTab->pSchema == (Schema *)0x0) {
          iDb = -0x8000;
        }
        else {
          iDb = -1;
          ppSVar3 = &pParse->db->aDb->pSchema;
          do {
            iDb = iDb + 1;
            pSVar2 = *ppSVar3;
            ppSVar3 = ppSVar3 + 4;
          } while (pSVar2 != pTab->pSchema);
        }
        sqlite3BeginWriteOperation(pParse,0,iDb);
        sqlite3RefillIndex(pParse,pIndex,-1);
      }
      else if ((ulong)pIndex->nColumn != 0) {
        uVar4 = 0;
        do {
          if (-1 < pIndex->aiColumn[uVar4]) {
            lVar5 = 0;
            do {
              bVar1 = pIndex->azColl[uVar4][lVar5];
              if (bVar1 == zColl[lVar5]) {
                if ((ulong)bVar1 == 0) goto LAB_001b5149;
              }
              else if (""[bVar1] != ""[(byte)zColl[lVar5]]) break;
              lVar5 = lVar5 + 1;
            } while( true );
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != pIndex->nColumn);
      }
    }
  }
  return;
}

Assistant:

static void reindexTable(Parse *pParse, Table *pTab, char const *zColl){
  if( !IsVirtual(pTab) ){
    Index *pIndex;              /* An index associated with pTab */

    for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
      if( zColl==0 || collationMatch(zColl, pIndex) ){
        int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
        sqlite3BeginWriteOperation(pParse, 0, iDb);
        sqlite3RefillIndex(pParse, pIndex, -1);
      }
    }
  }
}